

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int pk_write_ec_private(uchar **p,uchar *start,mbedtls_ecp_keypair *ec)

{
  uchar local_78 [8];
  uchar tmp [66];
  size_t byte_length;
  int ret;
  mbedtls_ecp_keypair *ec_local;
  uchar *start_local;
  uchar **p_local;
  
  register0x00000000 = (ec->grp).pbits + 7 >> 3;
  byte_length._4_4_ = mbedtls_mpi_write_binary(&ec->d,local_78,register0x00000000);
  if (byte_length._4_4_ == 0) {
    byte_length._4_4_ = mbedtls_asn1_write_octet_string(p,start,local_78,stack0xffffffffffffffd0);
  }
  mbedtls_platform_zeroize(local_78,stack0xffffffffffffffd0);
  return byte_length._4_4_;
}

Assistant:

static int pk_write_ec_private( unsigned char **p, unsigned char *start,
                                mbedtls_ecp_keypair *ec )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t byte_length = ( ec->grp.pbits + 7 ) / 8;
    unsigned char tmp[MBEDTLS_ECP_MAX_BYTES];

    ret = mbedtls_mpi_write_binary( &ec->d, tmp, byte_length );
    if( ret != 0 )
        goto exit;
    ret = mbedtls_asn1_write_octet_string( p, start, tmp, byte_length );

exit:
    mbedtls_platform_zeroize( tmp, byte_length );
    return( ret );
}